

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalCodeEditor_UNIX.cxx
# Opt level: O3

int make_args(char *s,int *aargc,char ***aargv)

{
  size_t sVar1;
  char **ppcVar2;
  char *pcVar3;
  char **ppcVar4;
  ulong uVar5;
  
  sVar1 = strlen(s);
  ppcVar2 = (char **)malloc(sVar1 * 4 & 0xfffffffffffffff8);
  ppcVar4 = ppcVar2;
  if (ppcVar2 != (char **)0x0) {
    pcVar3 = strtok(s," \t");
    uVar5 = 0;
    while (pcVar3 != (char *)0x0) {
      ppcVar2[uVar5] = pcVar3;
      uVar5 = uVar5 + 1;
      pcVar3 = strtok((char *)0x0," \t");
    }
    ppcVar4 = (char **)(uVar5 & 0xffffffff);
    ppcVar2[(long)ppcVar4] = (char *)0x0;
    *aargv = ppcVar2;
    *aargc = (int)uVar5;
  }
  return (int)ppcVar4;
}

Assistant:

static int make_args(char *s,         // string containing words (gets trashed!)
                     int *aargc,      // pointer to argc
                     char ***aargv) { // pointer to argv
  char *ss, **argv;
  if ((argv=(char**)malloc(sizeof(char*) * (strlen(s)/2)))==NULL) {
    return -1;
  }
  int t;
  for(t=0; (t==0)?(ss=strtok(s," \t")):(ss=strtok(0," \t")); t++) {
    argv[t] = ss;
  }
  argv[t] = 0;
  aargv[0] = argv;
  aargc[0] = t;
  return(t);
}